

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_pvrtc1_4.cpp
# Opt level: O1

uint64_t __thiscall
basisu::pvrtc4_image::local_endpoint_optimization_opaque
          (pvrtc4_image *this,uint32_t bx,uint32_t by,image *orig_img,bool perceptual)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint uVar7;
  color_rgba *pcVar8;
  pvrtc4_block *ppVar9;
  bool bVar10;
  pvrtc4_image *this_00;
  uint32_t i;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  uint64_t uVar16;
  uint64_t uVar17;
  uint64_t uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  int iVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  long lVar30;
  undefined7 in_register_00000081;
  ulong *puVar31;
  float *pfVar32;
  int iVar33;
  int iVar34;
  ulong uVar35;
  uint32_t i_5;
  float fVar36;
  float fVar37;
  float d2;
  float fVar38;
  undefined1 auVar39 [16];
  float d2_1;
  vec3F c_avg_orig;
  vec3F quant_colors [2];
  float total_weight [2];
  pvrtc4_block cur_blocks [3] [3];
  pvrtc4_block blocks0 [3] [3];
  vec<3U,_float> res;
  ulong local_160;
  float local_158;
  ulong local_150;
  undefined8 local_148;
  float fStack_140;
  ulong uStack_13c;
  float local_134;
  image *local_130;
  ulong local_128;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  pvrtc4_image *local_108;
  float local_100 [2];
  ulong local_f8;
  uint local_f0;
  undefined4 local_ec;
  undefined8 local_e8;
  ulong local_e0;
  float local_d8 [20];
  ulong local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  float afStack_3c [3];
  
  uVar23 = (ulong)by;
  uVar35 = (ulong)bx;
  iVar34 = 0;
  local_e0 = evaluate_1x1_endpoint_error(this,bx,by,orig_img,perceptual,false,0);
  if (local_e0 == 0) {
    return 0;
  }
  local_ec = (undefined4)CONCAT71(in_register_00000081,perceptual);
  uVar4 = this->m_width;
  uVar5 = this->m_height;
  pcVar8 = (orig_img->m_pixels).m_p;
  fVar36 = 0.0;
  fVar37 = 0.0;
  local_158 = 0.0;
  do {
    uVar19 = by * 4 + -1 + iVar34;
    if ((int)uVar19 < 0) {
      iVar33 = (int)uVar19 % (int)uVar5;
      uVar19 = iVar33 + uVar5;
      if (iVar33 == 0) {
        uVar19 = 0;
      }
    }
    else if ((int)uVar5 <= (int)uVar19) {
      uVar19 = (int)uVar19 % (int)uVar5;
    }
    iVar33 = -1;
    do {
      uVar11 = bx * 4 + iVar33;
      if ((int)uVar11 < 0) {
        iVar24 = (int)uVar11 % (int)uVar4;
        uVar11 = iVar24 + uVar4;
        if (iVar24 == 0) {
          uVar11 = 0;
        }
      }
      else if ((int)uVar4 <= (int)uVar11) {
        uVar11 = (int)uVar11 % (int)uVar4;
      }
      local_150 = uVar35;
      local_130 = orig_img;
      local_118 = uVar23;
      local_108 = this;
      if ((orig_img->m_width <= uVar11) || (orig_img->m_height <= uVar19)) {
        local_160 = CONCAT44(fVar37,fVar36);
LAB_00252bdc:
        __assert_fail("x < m_width && y < m_height",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.h"
                      ,0xb00,"const color_rgba &basisu::image::operator()(uint32_t, uint32_t) const"
                     );
      }
      uVar11 = uVar11 + orig_img->m_pitch * uVar19;
      if ((orig_img->m_pixels).m_size <= uVar11) {
        local_160 = CONCAT44(fVar37,fVar36);
LAB_00252c06:
        __assert_fail("i < m_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                      ,0x177,
                      "const T &basisu::vector<basisu::color_rgba>::operator[](size_t) const [T = basisu::color_rgba]"
                     );
      }
      auVar39 = ZEXT216(*(ushort *)&pcVar8[uVar11].field_0);
      auVar39 = pmovzxbd(auVar39,auVar39);
      fVar36 = fVar36 + (float)auVar39._0_4_;
      fVar37 = fVar37 + (float)auVar39._4_4_;
      local_158 = local_158 + (float)pcVar8[uVar11].field_0.m_comps[2];
      iVar33 = iVar33 + 1;
    } while (iVar33 != 6);
    iVar34 = iVar34 + 1;
  } while (iVar34 != 7);
  local_160 = CONCAT44(fVar37,fVar36);
  lVar14 = 0;
  do {
    *(float *)((long)&local_160 + lVar14 * 4) =
         *(float *)((long)&local_160 + lVar14 * 4) * 0.020408163;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 3);
  fStack_140 = local_158;
  local_148 = local_160;
  local_d8[0] = 0.0125;
  local_d8[1] = 0.0125;
  local_d8[2] = 0.0125;
  lVar14 = 0;
  do {
    *(float *)((long)&local_148 + lVar14 * 4) =
         *(float *)((long)&local_148 + lVar14 * 4) - local_d8[lVar14];
    lVar14 = lVar14 + 1;
  } while (lVar14 != 3);
  uStack_13c = local_160;
  local_134 = local_158;
  local_d8[0] = 0.0125;
  local_d8[1] = 0.0125;
  local_d8[2] = 0.0125;
  lVar14 = 3;
  do {
    *(float *)((long)&local_148 + lVar14 * 4) =
         *(float *)((long)&local_e8 + lVar14 * 4 + 4) + *(float *)((long)&local_148 + lVar14 * 4);
    lVar14 = lVar14 + 1;
  } while (lVar14 != 6);
  uVar4 = this->m_width;
  uVar5 = this->m_height;
  uVar19 = orig_img->m_width;
  uVar11 = orig_img->m_height;
  uVar6 = orig_img->m_pitch;
  local_110 = CONCAT44(local_110._4_4_,uVar6);
  uVar25 = (orig_img->m_pixels).m_size;
  pcVar8 = (orig_img->m_pixels).m_p;
  uVar23 = CONCAT71((uint7)(uint3)(by >> 8),1);
  iVar34 = 0;
  do {
    local_128 = CONCAT44(local_128._4_4_,iVar34);
    local_120 = CONCAT44(local_120._4_4_,(uint)uVar23);
    local_d8[2] = 0.0;
    local_d8[0] = 0.0;
    local_d8[1] = 0.0;
    local_d8[5] = 0.0;
    local_d8[3] = 0.0;
    local_d8[4] = 0.0;
    local_100[0] = 0.0;
    local_100[1] = 0.0;
    lVar14 = 0;
    do {
      uVar20 = by * 4 + -1 + (int)lVar14;
      if ((int)uVar20 < 0) {
        iVar33 = (int)uVar20 % (int)uVar5;
        uVar20 = iVar33 + uVar5;
        if (iVar33 == 0) {
          uVar20 = 0;
        }
      }
      else if ((int)uVar5 <= (int)uVar20) {
        uVar20 = (int)uVar20 % (int)uVar5;
      }
      lVar30 = 0;
      do {
        uVar12 = bx * 4 + -1 + (int)lVar30;
        if ((int)uVar12 < 0) {
          iVar33 = (int)uVar12 % (int)uVar4;
          uVar12 = iVar33 + uVar4;
          if (iVar33 == 0) {
            uVar12 = 0;
          }
        }
        else if ((int)uVar4 <= (int)uVar12) {
          uVar12 = (int)uVar12 % (int)uVar4;
        }
        if ((uVar19 <= uVar12) || (uVar11 <= uVar20)) goto LAB_00252bdc;
        uVar12 = uVar12 + uVar6 * uVar20;
        if (uVar25 <= uVar12) goto LAB_00252c06;
        auVar39 = ZEXT216(*(ushort *)&pcVar8[uVar12].field_0);
        auVar39 = pmovzxbd(auVar39,auVar39);
        local_88 = CONCAT44((float)auVar39._4_4_,(float)auVar39._0_4_);
        uStack_80 = CONCAT44(uStack_80._4_4_,(float)pcVar8[uVar12].field_0.m_comps[2]);
        fVar36 = 0.0;
        lVar15 = 0;
        do {
          fVar37 = *(float *)((long)&local_148 + lVar15 * 4) -
                   *(float *)((long)&local_88 + lVar15 * 4);
          fVar36 = fVar36 + fVar37 * fVar37;
          lVar15 = lVar15 + 1;
        } while (lVar15 != 3);
        fVar37 = 0.0;
        lVar15 = 0;
        do {
          fVar38 = *(float *)((long)&uStack_13c + lVar15 * 4) -
                   *(float *)((long)&local_88 + lVar15 * 4);
          fVar37 = fVar37 + fVar38 * fVar38;
          lVar15 = lVar15 + 1;
        } while (lVar15 != 3);
        fVar38 = local_endpoint_optimization_opaque::s_weights[lVar14][lVar30];
        lVar15 = 0;
        do {
          afStack_3c[lVar15] = *(float *)((long)&local_88 + lVar15 * 4) * fVar38;
          lVar15 = lVar15 + 1;
        } while (lVar15 != 3);
        bVar10 = fVar37 < fVar36;
        lVar15 = 0;
        do {
          local_d8[(ulong)bVar10 * 3 + lVar15] =
               afStack_3c[lVar15] + local_d8[(ulong)bVar10 * 3 + lVar15];
          lVar15 = lVar15 + 1;
        } while (lVar15 != 3);
        local_100[bVar10] = fVar38 + local_100[bVar10];
        lVar30 = lVar30 + 1;
      } while (lVar30 != 7);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 7);
    lVar14 = 0;
    do {
      *(float *)((long)&local_88 + lVar14 * 4) = local_d8[lVar14] / local_100[0];
      lVar14 = lVar14 + 1;
    } while (lVar14 != 3);
    fStack_140 = (float)uStack_80;
    local_148 = local_88;
    lVar14 = 0;
    do {
      *(float *)((long)&local_88 + lVar14 * 4) = local_d8[lVar14 + 3] / local_100[1];
      lVar14 = lVar14 + 1;
    } while (lVar14 != 3);
    local_134 = (float)uStack_80;
    uStack_13c = local_88;
    uVar23 = (ulong)((uint)uVar23 & 0xff);
    if (local_100[1] == 0.0 || local_100[0] == 0.0) {
      uVar23 = 0;
    }
    iVar34 = iVar34 + 1;
  } while (iVar34 != 4);
  if (uVar23 == 0) {
    fStack_140 = local_158;
    local_148 = local_160;
    local_134 = local_158;
    uStack_13c = local_160;
  }
  auVar39._8_8_ = 0;
  auVar39._0_8_ = uStack_13c;
  auVar39 = insertps(auVar39,local_134,0x20);
  uVar11 = (uint)(auVar39._0_4_ + 0.5);
  uVar19 = (uint)(auVar39._8_4_ + 0.5);
  if (0xfe < (int)uVar19) {
    uVar19 = 0xff;
  }
  uVar25 = (uint)(auVar39._4_4_ + 0.5);
  if (0xfe < (int)uVar25) {
    uVar25 = 0xff;
  }
  if (0xfe < (int)uVar11) {
    uVar11 = 0xff;
  }
  uVar20 = (int)(fStack_140 + 0.5);
  if (0xfe < (int)(fStack_140 + 0.5)) {
    uVar20 = 0xff;
  }
  uVar12 = (int)(local_148._4_4_ + 0.5);
  if (0xfe < (int)(local_148._4_4_ + 0.5)) {
    uVar12 = 0xff;
  }
  pfVar32 = local_d8;
  uVar22 = 0xff;
  if ((int)((float)local_148 + 0.5) < 0xff) {
    uVar22 = (int)((float)local_148 + 0.5);
  }
  uVar13 = 0;
  if ((int)uVar22 < 1) {
    uVar22 = uVar13;
  }
  local_128 = (ulong)uVar22;
  local_d8[0xc] = 0.0;
  local_d8[0xd] = 0.0;
  local_d8[0xe] = 0.0;
  local_d8[0xf] = 0.0;
  if ((int)uVar12 < 1) {
    uVar12 = uVar13;
  }
  local_e8 = (ulong)uVar12;
  local_d8[8] = 0.0;
  local_d8[9] = 0.0;
  local_d8[10] = 0.0;
  local_d8[0xb] = 0.0;
  if ((int)uVar20 < 1) {
    uVar20 = uVar13;
  }
  local_f8 = (ulong)uVar20;
  local_d8[4] = 0.0;
  local_d8[5] = 0.0;
  local_d8[6] = 0.0;
  local_d8[7] = 0.0;
  if ((int)uVar11 < 1) {
    uVar11 = uVar13;
  }
  local_110 = (ulong)uVar11;
  local_d8[0] = 0.0;
  local_d8[1] = 0.0;
  local_d8[2] = 0.0;
  local_d8[3] = 0.0;
  if ((int)uVar25 < 1) {
    uVar25 = uVar13;
  }
  local_120 = (ulong)uVar25;
  local_d8[0x10] = 0.0;
  local_d8[0x11] = 0.0;
  if ((int)uVar19 < 1) {
    uVar19 = uVar13;
  }
  uVar4 = this->m_block_width;
  uVar5 = this->m_block_height;
  uVar13 = (this->m_blocks).m_width;
  uVar27 = (this->m_blocks).m_height;
  uVar7 = (this->m_blocks).m_values.m_size;
  ppVar9 = (this->m_blocks).m_values.m_p;
  lVar14 = -1;
  do {
    uVar21 = (int)lVar14 + by;
    lVar14 = lVar14 + 1;
    lVar30 = 0;
    uVar28 = bx - 1;
    do {
      if ((int)uVar28 < 0) {
        uVar29 = (int)uVar28 % (int)uVar4 + uVar4;
        if ((int)uVar28 % (int)uVar4 == 0) {
          uVar29 = 0;
        }
      }
      else {
        uVar29 = uVar28;
        if ((int)uVar4 <= (int)uVar28) {
          uVar29 = (int)uVar28 % (int)uVar4;
        }
      }
      if ((int)uVar21 < 0) {
        uVar26 = (int)uVar21 % (int)uVar5 + uVar5;
        if ((int)uVar21 % (int)uVar5 == 0) {
          uVar26 = 0;
        }
      }
      else {
        uVar26 = uVar21;
        if ((int)uVar5 <= (int)uVar21) {
          uVar26 = (int)uVar21 % (int)uVar5;
        }
      }
      if ((uVar13 <= uVar29) || (uVar27 <= uVar26)) goto LAB_00252b93;
      uVar29 = uVar26 * uVar13 + uVar29;
      if (uVar7 <= uVar29) goto LAB_00252bb2;
      *(pvrtc4_block *)((long)pfVar32 + lVar30) = ppVar9[uVar29];
      uVar28 = uVar28 + 1;
      lVar30 = lVar30 + 0x18;
    } while (lVar30 != 0x48);
    pfVar32 = pfVar32 + 2;
  } while (lVar14 != 2);
  uVar13 = (this->m_blocks).m_width;
  local_f0 = uVar19;
  if ((bx < uVar13) && (by < (this->m_blocks).m_height)) {
    uVar19 = uVar13 * by + bx;
    if (uVar19 < (this->m_blocks).m_values.m_size) {
      bVar1 = g_pvrtc_5_nearest[uVar11 & 0xff];
      bVar2 = g_pvrtc_5_nearest[uVar25 & 0xff];
      bVar3 = g_pvrtc_5_nearest[uVar20 & 0xff];
      ppVar9 = (this->m_blocks).m_values.m_p;
      uVar11 = (uint)(byte)g_pvrtc_5_nearest[uVar12 & 0xff] << 5 |
               (uint)(byte)g_pvrtc_5_nearest[uVar22 & 0xff] << 10;
      ppVar9[uVar19].m_endpoints =
           (ppVar9[uVar19].m_endpoints & 0xffff0001) +
           (uint)(byte)g_pvrtc_4_nearest[uVar20 & 0xff] * 2 | uVar11 | 0x8000;
      uVar19 = (this->m_blocks).m_width;
      if ((uVar19 <= bx) || ((this->m_blocks).m_height <= by)) goto LAB_00252b93;
      local_128 = (ulong)uVar11;
      uVar19 = uVar19 * by + bx;
      if (uVar19 < (this->m_blocks).m_values.m_size) {
        ppVar9 = (this->m_blocks).m_values.m_p;
        uVar11 = (uint)bVar2 << 5 | (uint)bVar1 << 10;
        local_120 = (ulong)uVar11;
        local_f8 = (ulong)(uint)bVar3;
        ppVar9[uVar19].m_endpoints =
             (uVar11 | bVar3) << 0x10 | (uint)(ushort)ppVar9[uVar19].m_endpoints | 0x80000000;
        uVar16 = remap_pixels_influenced_by_endpoint(this,bx,by,orig_img,perceptual,false);
        uVar23 = local_e0;
        this_00 = local_108;
        puVar31 = &local_88;
        local_58 = 0;
        uStack_50 = 0;
        local_68 = 0;
        uStack_60 = 0;
        local_78 = 0;
        uStack_70 = 0;
        local_88 = 0;
        uStack_80 = 0;
        local_48 = 0;
        uVar4 = this->m_block_width;
        uVar5 = this->m_block_height;
        uVar19 = (this->m_blocks).m_width;
        uVar11 = (this->m_blocks).m_height;
        uVar25 = (this->m_blocks).m_values.m_size;
        ppVar9 = (this->m_blocks).m_values.m_p;
        lVar14 = -1;
        do {
          uVar20 = (uint)local_118;
          uVar22 = (int)lVar14 + uVar20;
          lVar14 = lVar14 + 1;
          lVar30 = 0;
          uVar12 = bx - 1;
          do {
            if ((int)uVar12 < 0) {
              uVar13 = (int)uVar12 % (int)uVar4 + uVar4;
              if ((int)uVar12 % (int)uVar4 == 0) {
                uVar13 = 0;
              }
            }
            else {
              uVar13 = uVar12;
              if ((int)uVar4 <= (int)uVar12) {
                uVar13 = (int)uVar12 % (int)uVar4;
              }
            }
            if ((int)uVar22 < 0) {
              uVar27 = (int)uVar22 % (int)uVar5 + uVar5;
              if ((int)uVar22 % (int)uVar5 == 0) {
                uVar27 = 0;
              }
            }
            else {
              uVar27 = uVar22;
              if ((int)uVar5 <= (int)uVar22) {
                uVar27 = (int)uVar22 % (int)uVar5;
              }
            }
            local_110 = uVar16;
            if ((uVar19 <= uVar13) || (uVar11 <= uVar27)) goto LAB_00252b93;
            uVar13 = uVar27 * uVar19 + uVar13;
            if (uVar25 <= uVar13) goto LAB_00252bb2;
            *(pvrtc4_block *)((long)puVar31 + lVar30) = ppVar9[uVar13];
            uVar12 = uVar12 + 1;
            lVar30 = lVar30 + 0x18;
          } while (lVar30 != 0x48);
          puVar31 = puVar31 + 1;
        } while (lVar14 != 2);
        uVar19 = (local_108->m_blocks).m_width;
        uVar11 = (uint)local_150;
        if ((uVar19 <= uVar11) || ((local_108->m_blocks).m_height <= uVar20)) goto LAB_00252b93;
        uVar19 = uVar19 * uVar20 + uVar11;
        if (uVar19 < (local_108->m_blocks).m_values.m_size) {
          ppVar9 = (local_108->m_blocks).m_values.m_p;
          ppVar9[uVar19].m_endpoints =
               (uint)local_120 |
               (ppVar9[uVar19].m_endpoints & 0xffff0001) +
               (uint)(byte)g_pvrtc_4_nearest[(byte)local_f0] * 2 | 0x8000;
          uVar19 = (local_108->m_blocks).m_width;
          if ((uVar19 <= uVar11) || ((local_108->m_blocks).m_height <= uVar20)) goto LAB_00252b93;
          uVar19 = uVar19 * uVar20 + uVar11;
          if (uVar19 < (local_108->m_blocks).m_values.m_size) {
            ppVar9 = (local_108->m_blocks).m_values.m_p;
            ppVar9[uVar19].m_endpoints =
                 ((uint)local_128 | (uint)local_f8) << 0x10 |
                 (uint)(ushort)ppVar9[uVar19].m_endpoints | 0x80000000;
            uVar17 = remap_pixels_influenced_by_endpoint
                               (local_108,uVar11,uVar20,local_130,perceptual,false);
            uVar18 = uVar17;
            if (uVar16 < uVar17) {
              uVar18 = uVar16;
            }
            if (uVar18 <= uVar23) {
              uVar4 = (uint32_t)local_150;
              if (uVar17 <= uVar16) {
                uVar16 = evaluate_1x1_endpoint_error
                                   (this_00,uVar4,uVar20,local_130,perceptual,false,0);
                if (uVar17 == uVar16) {
                  return uVar17;
                }
                __assert_fail("e03_err_1 == evaluate_1x1_endpoint_error(bx, by, orig_img, perceptual, false)"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_pvrtc1_4.cpp"
                              ,0x230,
                              "uint64_t basisu::pvrtc4_image::local_endpoint_optimization_opaque(uint32_t, uint32_t, const image &, bool)"
                             );
              }
              lVar14 = -1;
              puVar31 = &local_88;
              do {
                uVar11 = (int)lVar14 + uVar20;
                lVar14 = lVar14 + 1;
                lVar30 = 0;
                uVar19 = uVar4 - 1;
                do {
                  uVar5 = this_00->m_block_width;
                  if ((int)uVar19 < 0) {
                    uVar25 = uVar5 + (int)uVar19 % (int)uVar5;
                    if ((int)uVar19 % (int)uVar5 == 0) {
                      uVar25 = 0;
                    }
                  }
                  else {
                    uVar25 = uVar19;
                    if ((int)uVar5 <= (int)uVar19) {
                      uVar25 = (int)uVar19 % (int)uVar5;
                    }
                  }
                  uVar5 = this_00->m_block_height;
                  if ((int)uVar11 < 0) {
                    uVar12 = uVar5 + (int)uVar11 % (int)uVar5;
                    if ((int)uVar11 % (int)uVar5 == 0) {
                      uVar12 = 0;
                    }
                  }
                  else {
                    uVar12 = uVar11;
                    if ((int)uVar5 <= (int)uVar11) {
                      uVar12 = (int)uVar11 % (int)uVar5;
                    }
                  }
                  uVar22 = (this_00->m_blocks).m_width;
                  if ((uVar22 <= uVar25) || ((this_00->m_blocks).m_height <= uVar12))
                  goto LAB_00252b93;
                  uVar25 = uVar22 * uVar12 + uVar25;
                  if ((this_00->m_blocks).m_values.m_size <= uVar25) goto LAB_00252bb2;
                  (this_00->m_blocks).m_values.m_p[uVar25] =
                       *(pvrtc4_block *)((long)puVar31 + lVar30);
                  uVar19 = uVar19 + 1;
                  lVar30 = lVar30 + 0x18;
                } while (lVar30 != 0x48);
                puVar31 = puVar31 + 1;
                if (lVar14 == 2) {
                  uVar18 = evaluate_1x1_endpoint_error
                                     (this_00,uVar4,uVar20,local_130,perceptual,false,0);
                  if (uVar16 == uVar18) {
                    return uVar16;
                  }
                  __assert_fail("e03_err_0 == evaluate_1x1_endpoint_error(bx, by, orig_img, perceptual, false)"
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_pvrtc1_4.cpp"
                                ,0x22c,
                                "uint64_t basisu::pvrtc4_image::local_endpoint_optimization_opaque(uint32_t, uint32_t, const image &, bool)"
                               );
                }
              } while( true );
            }
            lVar14 = -1;
            pfVar32 = local_d8;
            do {
              uVar25 = (int)lVar14 + uVar20;
              lVar14 = lVar14 + 1;
              lVar30 = 0;
              uVar19 = uVar11 - 1;
              do {
                uVar4 = this_00->m_block_width;
                if ((int)uVar19 < 0) {
                  uVar12 = uVar4 + (int)uVar19 % (int)uVar4;
                  if ((int)uVar19 % (int)uVar4 == 0) {
                    uVar12 = 0;
                  }
                }
                else {
                  uVar12 = uVar19;
                  if ((int)uVar4 <= (int)uVar19) {
                    uVar12 = (int)uVar19 % (int)uVar4;
                  }
                }
                uVar4 = this_00->m_block_height;
                if ((int)uVar25 < 0) {
                  uVar22 = uVar4 + (int)uVar25 % (int)uVar4;
                  if ((int)uVar25 % (int)uVar4 == 0) {
                    uVar22 = 0;
                  }
                }
                else {
                  uVar22 = uVar25;
                  if ((int)uVar4 <= (int)uVar25) {
                    uVar22 = (int)uVar25 % (int)uVar4;
                  }
                }
                uVar13 = (this_00->m_blocks).m_width;
                if ((uVar13 <= uVar12) || ((this_00->m_blocks).m_height <= uVar22))
                goto LAB_00252b93;
                uVar12 = uVar13 * uVar22 + uVar12;
                if ((this_00->m_blocks).m_values.m_size <= uVar12) goto LAB_00252bb2;
                (this_00->m_blocks).m_values.m_p[uVar12] = *(pvrtc4_block *)((long)pfVar32 + lVar30)
                ;
                uVar19 = uVar19 + 1;
                lVar30 = lVar30 + 0x18;
              } while (lVar30 != 0x48);
              pfVar32 = pfVar32 + 2;
              if (lVar14 == 2) {
                return uVar23;
              }
            } while( true );
          }
        }
      }
    }
LAB_00252bb2:
    __assert_fail("i < m_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                  ,0x178,
                  "T &basisu::vector<basisu::pvrtc4_block>::operator[](size_t) [T = basisu::pvrtc4_block]"
                 );
  }
LAB_00252b93:
  __assert_fail("x < m_width && y < m_height",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.h"
                ,0xd2a,
                "T &basisu::vector2D<basisu::pvrtc4_block>::operator()(uint32_t, uint32_t) [T = basisu::pvrtc4_block]"
               );
}

Assistant:

uint64_t pvrtc4_image::local_endpoint_optimization_opaque(uint32_t bx, uint32_t by, const image& orig_img, bool perceptual)
	{
		uint64_t initial_error = evaluate_1x1_endpoint_error(bx, by, orig_img, perceptual, false);
		if (!initial_error)
			return initial_error;

		vec3F c_avg_orig(0);

		for (int y = 0; y < 7; y++)
		{
			const uint32_t py = wrap_y(by * 4 + y - 1);
			for (uint32_t x = 0; x < 7; x++)
			{
				const uint32_t px = wrap_x(bx * 4 + x - 1);

				const color_rgba& c = orig_img(px, py);

				c_avg_orig[0] += c[0];
				c_avg_orig[1] += c[1];
				c_avg_orig[2] += c[2];
			}
		}

		c_avg_orig *= 1.0f / 49.0f;

		vec3F quant_colors[2];
		quant_colors[0].set(c_avg_orig);
		quant_colors[0] -= vec3F(.0125f);

		quant_colors[1].set(c_avg_orig);
		quant_colors[1] += vec3F(.0125f);

		float total_weight[2];

		bool success = true;

		for (uint32_t pass = 0; pass < 4; pass++)
		{
			vec3F new_colors[2] = { vec3F(0), vec3F(0) };
			memset(total_weight, 0, sizeof(total_weight));

			static const float s_weights[7][7] =
			{
				{ 1.000000f, 1.637089f, 2.080362f, 2.242640f, 2.080362f, 1.637089f, 1.000000f },
				{ 1.637089f, 2.414213f, 3.006572f, 3.242640f, 3.006572f, 2.414213f, 1.637089f },
				{ 2.080362f, 3.006572f, 3.828426f, 4.242640f, 3.828426f, 3.006572f, 2.080362f },
				{ 2.242640f, 3.242640f, 4.242640f, 5.000000f, 4.242640f, 3.242640f, 2.242640f },
				{ 2.080362f, 3.006572f, 3.828426f, 4.242640f, 3.828426f, 3.006572f, 2.080362f },
				{ 1.637089f, 2.414213f, 3.006572f, 3.242640f, 3.006572f, 2.414213f, 1.637089f },
				{ 1.000000f, 1.637089f, 2.080362f, 2.242640f, 2.080362f, 1.637089f, 1.000000f }
			};

			for (int y = 0; y < 7; y++)
			{
				const uint32_t py = wrap_y(by * 4 + y - 1);
				for (uint32_t x = 0; x < 7; x++)
				{
					const uint32_t px = wrap_x(bx * 4 + x - 1);

					const color_rgba& orig_c = orig_img(px, py);

					vec3F color(orig_c[0], orig_c[1], orig_c[2]);

					uint32_t c = quant_colors[0].squared_distance(color) > quant_colors[1].squared_distance(color);

					const float weight = s_weights[y][x];
					new_colors[c] += color * weight;

					total_weight[c] += weight;
				}
			}

			if (!total_weight[0] || !total_weight[1])
				success = false;

			quant_colors[0] = new_colors[0] / (float)total_weight[0];
			quant_colors[1] = new_colors[1] / (float)total_weight[1];
		}

		if (!success)
		{
			quant_colors[0] = c_avg_orig;
			quant_colors[1] = c_avg_orig;
		}

		vec4F colors[2] = { quant_colors[0], quant_colors[1] };

		colors[0] += vec3F(.5f);
		colors[1] += vec3F(.5f);
		color_rgba color_0((int)colors[0][0], (int)colors[0][1], (int)colors[0][2], 0);
		color_rgba color_1((int)colors[1][0], (int)colors[1][1], (int)colors[1][2], 0);

		pvrtc4_block cur_blocks[3][3];
		
		for (int y = -1; y <= 1; y++)
		{
			for (int x = -1; x <= 1; x++)
			{
				const uint32_t block_x = wrap_block_x(bx + x);
				const uint32_t block_y = wrap_block_y(by + y);
				cur_blocks[x + 1][y + 1] = m_blocks(block_x, block_y);
			}
		}

		color_rgba l1(0), h1(0);

		l1[0] = g_pvrtc_5_nearest[color_0[0]];
		h1[0] = g_pvrtc_5_nearest[color_1[0]];

		l1[1] = g_pvrtc_5_nearest[color_0[1]];
		h1[1] = g_pvrtc_5_nearest[color_1[1]];

		l1[2] = g_pvrtc_4_nearest[color_0[2]];
		h1[2] = g_pvrtc_5_nearest[color_0[2]];

		l1[3] = 0;
		h1[3] = 0;

		m_blocks(bx, by).set_endpoint_raw(0, l1, true);
		m_blocks(bx, by).set_endpoint_raw(1, h1, true);

		uint64_t e03_err_0 = remap_pixels_influenced_by_endpoint(bx, by, orig_img, perceptual, false);

		pvrtc4_block blocks0[3][3];
		for (int y = -1; y <= 1; y++)
		{
			for (int x = -1; x <= 1; x++)
			{
				const uint32_t block_x = wrap_block_x(bx + x);
				const uint32_t block_y = wrap_block_y(by + y);
				blocks0[x + 1][y + 1] = m_blocks(block_x, block_y);
			}
		}

		l1[0] = g_pvrtc_5_nearest[color_1[0]];
		h1[0] = g_pvrtc_5_nearest[color_0[0]];

		l1[1] = g_pvrtc_5_nearest[color_1[1]];
		h1[1] = g_pvrtc_5_nearest[color_0[1]];

		l1[2] = g_pvrtc_4_nearest[color_1[2]];
		h1[2] = g_pvrtc_5_nearest[color_0[2]];

		l1[3] = 0;
		h1[3] = 0;

		m_blocks(bx, by).set_endpoint_raw(0, l1, true);
		m_blocks(bx, by).set_endpoint_raw(1, h1, true);

		uint64_t e03_err_1 = remap_pixels_influenced_by_endpoint(bx, by, orig_img, perceptual, false);

		if (initial_error < basisu::minimum(e03_err_0, e03_err_1))
		{
			for (int y = -1; y <= 1; y++)
			{
				for (int x = -1; x <= 1; x++)
				{
					const uint32_t block_x = wrap_block_x(bx + x);
					const uint32_t block_y = wrap_block_y(by + y);
					m_blocks(block_x, block_y) = cur_blocks[x + 1][y + 1];
				}
			}
			return initial_error;
		}
		else if (e03_err_0 < e03_err_1)
		{
			for (int y = -1; y <= 1; y++)
			{
				for (int x = -1; x <= 1; x++)
				{
					const uint32_t block_x = wrap_block_x(bx + x);
					const uint32_t block_y = wrap_block_y(by + y);
					m_blocks(block_x, block_y) = blocks0[x + 1][y + 1];
				}
			}
			assert(e03_err_0 == evaluate_1x1_endpoint_error(bx, by, orig_img, perceptual, false));
			return e03_err_0;
		}

		assert(e03_err_1 == evaluate_1x1_endpoint_error(bx, by, orig_img, perceptual, false));
		return e03_err_1;
	}